

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  _func_int *p_Var8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int *piVar18;
  long lVar19;
  void *pvVar20;
  int iVar21;
  byte bVar22;
  uint _h;
  byte bVar23;
  int iVar24;
  int iVar25;
  float *pfVar26;
  uint _w;
  float *pfVar27;
  ulong uVar28;
  int iVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  ulong uVar32;
  float *pfVar33;
  float *pfVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  bool bVar38;
  undefined1 auVar39 [12];
  float fVar41;
  float fVar42;
  float fVar43;
  v4sf one;
  float fVar44;
  float fVar45;
  float fVar58;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ulong local_110;
  ulong local_108;
  Mat local_b8;
  undefined1 local_68 [16];
  long local_58;
  void *local_50;
  void *local_48;
  long local_40;
  ulong local_38;
  undefined1 auVar40 [16];
  
  uVar32 = bottom_blob->elemsize;
  iVar3 = bottom_blob->elempack;
  p_Var5 = this->_vptr_Convolution1D_x86[-3];
  iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar25 = *(int *)(&this->field_0xd8 + (long)p_Var5);
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86 + (long)p_Var5),bottom_blob,
             &local_b8,opt);
  iVar21 = local_b8.h;
  iVar29 = -100;
  if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
    bVar22 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) & 3) == 0 &
             opt->use_packing_layout;
    uVar37 = (ulong)(uint)local_b8.h;
    iVar29 = (uint)bVar22 + (uint)bVar22 * 2 + 1;
    iVar4 = (~((iVar4 + -1) * iVar25) + local_b8.w) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]);
    _w = iVar4 + 1;
    _h = (int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / iVar29;
    Mat::create(top_blob,_w,_h,uVar32 / (ulong)(long)iVar3 << bVar22 * '\x02',iVar29,
                opt->blob_allocator);
    auVar40 = _DAT_00516ee0;
    iVar29 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar23 = 0 < (int)_h & bVar22;
      if (iVar3 == 4 && bVar23 == 1) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_108 = 0;
        fVar41 = (float)DAT_00516ee0;
        fVar42 = DAT_00516ee0._4_4_;
        fVar43 = DAT_00516ee0._8_4_;
        fVar44 = DAT_00516ee0._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar30 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_108 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar29 = 0;
            iVar25 = 0;
            do {
              auVar51 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar77 = ZEXT816(0);
              }
              else {
                auVar77 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + local_108 * 0x10);
              }
              if (0 < iVar21) {
                pfVar34 = (float *)((this->weight_data_packed).cstep * local_108 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var8 = pp_Var7[-3];
                pfVar27 = (float *)((long)local_b8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar29) * 4 +
                                   0xc);
                uVar32 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var8)) {
                    pfVar26 = pfVar27;
                    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                    do {
                      fVar45 = pfVar26[-3];
                      fVar67 = pfVar26[-2];
                      fVar58 = pfVar26[-1];
                      fVar69 = *pfVar26;
                      fVar72 = auVar77._4_4_;
                      fVar73 = auVar77._8_4_;
                      fVar74 = auVar77._12_4_;
                      auVar77._0_4_ =
                           pfVar34[0xc] * fVar69 +
                           pfVar34[8] * fVar58 + pfVar34[4] * fVar67 +
                           *pfVar34 * fVar45 + auVar77._0_4_;
                      auVar77._4_4_ =
                           pfVar34[0xd] * fVar69 +
                           pfVar34[9] * fVar58 + pfVar34[5] * fVar67 + pfVar34[1] * fVar45 + fVar72;
                      auVar77._8_4_ =
                           pfVar34[0xe] * fVar69 +
                           pfVar34[10] * fVar58 + pfVar34[6] * fVar67 + pfVar34[2] * fVar45 + fVar73
                      ;
                      auVar77._12_4_ =
                           pfVar34[0xf] * fVar69 +
                           pfVar34[0xb] * fVar58 + pfVar34[7] * fVar67 +
                           pfVar34[3] * fVar45 + fVar74;
                      pfVar34 = pfVar34 + 0x10;
                      pfVar26 = pfVar26 + (*(int *)(&this->field_0xd8 + (long)p_Var8) << 2);
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  uVar32 = uVar32 + 1;
                  pfVar27 = (float *)((long)pfVar27 +
                                     (long)local_b8.w *
                                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                                     );
                } while (uVar32 != uVar37);
              }
              fVar45 = auVar77._0_4_;
              fVar67 = auVar77._4_4_;
              fVar58 = auVar77._8_4_;
              fVar69 = auVar77._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar77 = maxps(auVar77,auVar51);
                break;
              case 2:
                auVar50 = maxps(auVar77,auVar51);
                auVar51 = minps(auVar77,auVar51);
                fVar45 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar77._4_4_ = fVar45 * auVar51._4_4_ + auVar50._4_4_;
                auVar77._0_4_ = fVar45 * auVar51._0_4_ + auVar50._0_4_;
                auVar77._8_4_ = fVar45 * auVar51._8_4_ + auVar50._8_4_;
                auVar77._12_4_ = fVar45 * auVar51._12_4_ + auVar50._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar48._4_4_ = uVar1;
                auVar48._0_4_ = uVar1;
                auVar48._8_4_ = uVar1;
                auVar48._12_4_ = uVar1;
                auVar51 = maxps(auVar77,auVar48);
                auVar12._4_4_ = uVar2;
                auVar12._0_4_ = uVar2;
                auVar12._8_4_ = uVar2;
                auVar12._12_4_ = uVar2;
                auVar77 = minps(auVar51,auVar12);
                break;
              case 4:
                auVar63._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                auVar63._8_4_ = -fVar58;
                auVar63._12_4_ = -fVar69;
                auVar51 = minps(auVar63,_DAT_00516ea0);
                auVar51 = maxps(auVar51,_DAT_00516eb0);
                fVar67 = auVar51._0_4_ * 1.442695 + 0.5;
                fVar69 = auVar51._4_4_ * 1.442695 + 0.5;
                fVar73 = auVar51._8_4_ * 1.442695 + 0.5;
                fVar75 = auVar51._12_4_ * 1.442695 + 0.5;
                fVar45 = (float)(int)fVar67;
                fVar58 = (float)(int)fVar69;
                fVar72 = (float)(int)fVar73;
                fVar74 = (float)(int)fVar75;
                fVar45 = fVar45 - (float)(-(uint)(fVar67 < fVar45) & (uint)fVar41);
                fVar58 = fVar58 - (float)(-(uint)(fVar69 < fVar58) & (uint)fVar42);
                fVar72 = fVar72 - (float)(-(uint)(fVar73 < fVar72) & (uint)fVar43);
                fVar74 = fVar74 - (float)(-(uint)(fVar75 < fVar74) & (uint)fVar44);
                fVar67 = fVar45 * -0.6931472 + auVar51._0_4_;
                fVar69 = fVar58 * -0.6931472 + auVar51._4_4_;
                fVar73 = fVar72 * -0.6931472 + auVar51._8_4_;
                fVar75 = fVar74 * -0.6931472 + auVar51._12_4_;
                auVar49._0_4_ =
                     fVar67 + fVar41 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                auVar49._4_4_ =
                     fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                auVar49._8_4_ =
                     fVar73 + fVar43 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73;
                auVar49._12_4_ =
                     fVar75 + fVar44 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75;
                fVar73 = (float)((int)fVar45 * 0x800000 + (int)fVar41) * auVar49._0_4_ + fVar41;
                fVar75 = (float)((int)fVar58 * 0x800000 + (int)fVar42) * auVar49._4_4_ + fVar42;
                fVar72 = (float)((int)fVar72 * 0x800000 + (int)fVar43) * auVar49._8_4_ + fVar43;
                fVar74 = (float)((int)fVar74 * 0x800000 + (int)fVar44) * auVar49._12_4_ + fVar44;
                auVar11._4_4_ = fVar75;
                auVar11._0_4_ = fVar73;
                auVar11._8_4_ = fVar72;
                auVar11._12_4_ = fVar74;
                auVar51 = rcpps(auVar49,auVar11);
                fVar45 = auVar51._0_4_;
                fVar67 = auVar51._4_4_;
                fVar58 = auVar51._8_4_;
                fVar69 = auVar51._12_4_;
                auVar77._0_4_ = (fVar41 - fVar73 * fVar45) * fVar45 + fVar45;
                auVar77._4_4_ = (fVar42 - fVar75 * fVar67) * fVar67 + fVar67;
                auVar77._8_4_ = (fVar43 - fVar72 * fVar58) * fVar58 + fVar58;
                auVar77._12_4_ = (fVar44 - fVar74 * fVar69) * fVar69 + fVar69;
                break;
              case 5:
                auVar51 = minps(auVar77,_DAT_00516ea0);
                auVar51 = maxps(auVar51,_DAT_00516eb0);
                fVar72 = auVar51._0_4_ * 1.442695 + 0.5;
                fVar73 = auVar51._4_4_ * 1.442695 + 0.5;
                fVar74 = auVar51._8_4_ * 1.442695 + 0.5;
                fVar75 = auVar51._12_4_ * 1.442695 + 0.5;
                fVar66 = (float)(int)fVar72;
                fVar68 = (float)(int)fVar73;
                fVar70 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar66 = fVar66 - (float)(-(uint)(fVar72 < fVar66) & (uint)fVar41);
                fVar68 = fVar68 - (float)(-(uint)(fVar73 < fVar68) & (uint)fVar42);
                fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar43);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar44);
                fVar72 = auVar51._0_4_ - fVar66 * 0.6931472;
                fVar73 = auVar51._4_4_ - fVar68 * 0.6931472;
                fVar74 = auVar51._8_4_ - fVar70 * 0.6931472;
                fVar75 = auVar51._12_4_ - fVar71 * 0.6931472;
                auVar76._0_4_ =
                     (float)((int)fVar66 * 0x800000 + (int)fVar41) *
                     (fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72) +
                     fVar41;
                auVar76._4_4_ =
                     (float)((int)fVar68 * 0x800000 + (int)fVar42) *
                     (fVar73 + fVar42 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73) +
                     fVar42;
                auVar76._8_4_ =
                     (float)((int)fVar70 * 0x800000 + (int)fVar43) *
                     (fVar74 + fVar43 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                     fVar43;
                auVar76._12_4_ =
                     (float)((int)fVar71 * 0x800000 + (int)fVar44) *
                     (fVar75 + fVar44 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75) +
                     fVar44;
                auVar77 = maxps(auVar76,_DAT_00516f50);
                fVar72 = (float)(auVar77._0_4_ & 0x807fffff | 0x3f000000);
                fVar74 = (float)(auVar77._4_4_ & 0x807fffff | 0x3f000000);
                fVar66 = (float)(auVar77._8_4_ & 0x807fffff | 0x3f000000);
                fVar70 = (float)(auVar77._12_4_ & 0x807fffff | 0x3f000000);
                fVar73 = fVar72 + -1.0 + (float)(-(uint)(fVar72 < 0.70710677) & (uint)fVar72);
                fVar75 = fVar74 + -1.0 + (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar74);
                fVar68 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                fVar71 = fVar70 + -1.0 + (float)(-(uint)(fVar70 < 0.70710677) & (uint)fVar70);
                auVar46._0_8_ =
                     CONCAT44(-(uint)(auVar76._4_4_ <= 0.0),-(uint)(auVar76._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar46._8_4_ = -(uint)(auVar76._8_4_ <= 0.0) & 0x7fffffff;
                auVar46._12_4_ = -(uint)(auVar76._12_4_ <= 0.0) & 0x7fffffff;
                auVar51._4_4_ =
                     ~-(uint)(auVar76._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar77._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar42)) * 0.6931472 +
                             fVar75 + (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 +
                                             0.116769984) * fVar75 + -0.12420141) * fVar75 +
                                           0.14249323) * fVar75 + -0.16668057) * fVar75 + 0.20000714
                                         ) * fVar75 + -0.24999994) * fVar75 + 0.3333333) * fVar75 +
                                      -0.5) * fVar75 * fVar75) * -2.0);
                auVar51._0_4_ =
                     ~-(uint)(auVar76._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar77._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar72 < 0.70710677) & (uint)fVar41)) * 0.6931472 +
                             fVar73 + (((((((((fVar73 * 0.070376836 + -0.1151461) * fVar73 +
                                             0.116769984) * fVar73 + -0.12420141) * fVar73 +
                                           0.14249323) * fVar73 + -0.16668057) * fVar73 + 0.20000714
                                         ) * fVar73 + -0.24999994) * fVar73 + 0.3333333) * fVar73 +
                                      -0.5) * fVar73 * fVar73) * -2.0);
                auVar51._8_4_ =
                     ~-(uint)(auVar76._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar77._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar43)) * 0.6931472 +
                             fVar68 + (((((((((fVar68 * 0.070376836 + -0.1151461) * fVar68 +
                                             0.116769984) * fVar68 + -0.12420141) * fVar68 +
                                           0.14249323) * fVar68 + -0.16668057) * fVar68 + 0.20000714
                                         ) * fVar68 + -0.24999994) * fVar68 + 0.3333333) * fVar68 +
                                      -0.5) * fVar68 * fVar68) * -2.0);
                auVar51._12_4_ =
                     ~-(uint)(auVar76._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar77._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar70 < 0.70710677) & (uint)fVar44)) * 0.6931472 +
                             fVar71 + (((((((((fVar71 * 0.070376836 + -0.1151461) * fVar71 +
                                             0.116769984) * fVar71 + -0.12420141) * fVar71 +
                                           0.14249323) * fVar71 + -0.16668057) * fVar71 + 0.20000714
                                         ) * fVar71 + -0.24999994) * fVar71 + 0.3333333) * fVar71 +
                                      -0.5) * fVar71 * fVar71) * -2.0);
                auVar51 = minps(auVar46 | auVar51,_DAT_00516ea0);
                auVar51 = maxps(auVar51,_DAT_00516eb0);
                fVar72 = auVar51._0_4_ * 1.442695 + 0.5;
                fVar73 = auVar51._4_4_ * 1.442695 + 0.5;
                fVar74 = auVar51._8_4_ * 1.442695 + 0.5;
                fVar75 = auVar51._12_4_ * 1.442695 + 0.5;
                fVar66 = (float)(int)fVar72;
                fVar68 = (float)(int)fVar73;
                fVar70 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar66 = fVar66 - (float)(-(uint)(fVar72 < fVar66) & (uint)fVar41);
                fVar68 = fVar68 - (float)(-(uint)(fVar73 < fVar68) & (uint)fVar42);
                fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar43);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar44);
                fVar72 = auVar51._0_4_ - fVar66 * 0.6931472;
                fVar73 = auVar51._4_4_ - fVar68 * 0.6931472;
                fVar74 = auVar51._8_4_ - fVar70 * 0.6931472;
                fVar75 = auVar51._12_4_ - fVar71 * 0.6931472;
                auVar47._0_4_ =
                     fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72;
                auVar47._4_4_ =
                     fVar73 + fVar42 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73;
                auVar47._8_4_ =
                     fVar74 + fVar43 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74;
                auVar47._12_4_ =
                     fVar75 + fVar44 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75;
                fVar66 = (float)((int)fVar66 * 0x800000 + (int)fVar41) * auVar47._0_4_ + fVar41;
                fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar42) * auVar47._4_4_ + fVar42;
                fVar70 = (float)((int)fVar70 * 0x800000 + (int)fVar43) * auVar47._8_4_ + fVar43;
                fVar71 = (float)((int)fVar71 * 0x800000 + (int)fVar44) * auVar47._12_4_ + fVar44;
                auVar56._4_4_ = fVar68;
                auVar56._0_4_ = fVar66;
                auVar56._8_4_ = fVar70;
                auVar56._12_4_ = fVar71;
                auVar51 = rcpps(auVar47,auVar56);
                fVar72 = auVar51._0_4_;
                fVar73 = auVar51._4_4_;
                fVar74 = auVar51._8_4_;
                fVar75 = auVar51._12_4_;
                auVar77._0_4_ =
                     fVar45 * (fVar72 + fVar72 + -1.0 + (2.0 - fVar66 * (fVar72 + fVar72)) * fVar72)
                ;
                auVar77._4_4_ =
                     fVar67 * (fVar73 + fVar73 + -1.0 + (2.0 - fVar68 * (fVar73 + fVar73)) * fVar73)
                ;
                auVar77._8_4_ =
                     fVar58 * (fVar74 + fVar74 + -1.0 + (2.0 - fVar70 * (fVar74 + fVar74)) * fVar74)
                ;
                auVar77._12_4_ =
                     fVar69 * (fVar75 + fVar75 + -1.0 + (2.0 - fVar71 * (fVar75 + fVar75)) * fVar75)
                ;
                break;
              case 6:
                fVar72 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar73 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar50._0_4_ = fVar72 * fVar45 + fVar73;
                auVar50._4_4_ = fVar72 * fVar67 + fVar73;
                auVar50._8_4_ = fVar72 * fVar58 + fVar73;
                auVar50._12_4_ = fVar72 * fVar69 + fVar73;
                auVar51 = maxps(auVar50,auVar51);
                auVar51 = minps(auVar51,auVar40);
                auVar77._0_4_ = fVar45 * auVar51._0_4_;
                auVar77._4_4_ = fVar67 * auVar51._4_4_;
                auVar77._8_4_ = fVar58 * auVar51._8_4_;
                auVar77._12_4_ = fVar69 * auVar51._12_4_;
              }
              *pauVar30 = auVar77;
              pauVar30 = pauVar30 + 1;
              iVar29 = iVar29 + 4;
              bVar38 = iVar25 != iVar4;
              iVar25 = iVar25 + 1;
            } while (bVar38);
          }
          local_108 = local_108 + 1;
        } while (local_108 != _h);
      }
      auVar77 = _DAT_00516ee0;
      auVar51 = _DAT_00516eb0;
      auVar40 = _DAT_00516ea0;
      if (bVar23 == 1 && iVar3 == 1) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar32 = 0;
        fVar41 = (float)DAT_00516ee0;
        fVar42 = DAT_00516ee0._4_4_;
        fVar43 = DAT_00516ee0._8_4_;
        fVar44 = DAT_00516ee0._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar30 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar25 = 0;
            do {
              auVar50 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar64 = ZEXT816(0);
              }
              else {
                auVar64 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar32 * 0x10);
              }
              if (0 < iVar21) {
                pfVar34 = (float *)((this->weight_data_packed).cstep * uVar32 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var8 = pp_Var7[-3];
                pfVar27 = (float *)((long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar25) * 4
                                   + (long)local_b8.data);
                uVar31 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var8)) {
                    pfVar26 = pfVar27;
                    auVar56 = auVar64;
                    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                    do {
                      fVar45 = *pfVar26;
                      auVar64._0_4_ = auVar56._0_4_ + *pfVar34 * fVar45;
                      auVar64._4_4_ = auVar56._4_4_ + pfVar34[1] * fVar45;
                      auVar64._8_4_ = auVar56._8_4_ + pfVar34[2] * fVar45;
                      auVar64._12_4_ = auVar56._12_4_ + pfVar34[3] * fVar45;
                      pfVar34 = pfVar34 + 4;
                      pfVar26 = pfVar26 + *(int *)(&this->field_0xd8 + (long)p_Var8);
                      iVar29 = iVar29 + -1;
                      auVar56 = auVar64;
                    } while (iVar29 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar27 = (float *)((long)pfVar27 +
                                     (long)local_b8.w *
                                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                                     );
                } while (uVar31 != uVar37);
              }
              fVar45 = auVar64._0_4_;
              fVar67 = auVar64._4_4_;
              fVar58 = auVar64._8_4_;
              fVar69 = auVar64._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar64 = maxps(auVar64,auVar50);
                break;
              case 2:
                auVar56 = maxps(auVar64,auVar50);
                auVar50 = minps(auVar64,auVar50);
                fVar45 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar64._4_4_ = fVar45 * auVar50._4_4_ + auVar56._4_4_;
                auVar64._0_4_ = fVar45 * auVar50._0_4_ + auVar56._0_4_;
                auVar64._8_4_ = fVar45 * auVar50._8_4_ + auVar56._8_4_;
                auVar64._12_4_ = fVar45 * auVar50._12_4_ + auVar56._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar54._4_4_ = uVar1;
                auVar54._0_4_ = uVar1;
                auVar54._8_4_ = uVar1;
                auVar54._12_4_ = uVar1;
                auVar50 = maxps(auVar64,auVar54);
                auVar14._4_4_ = uVar2;
                auVar14._0_4_ = uVar2;
                auVar14._8_4_ = uVar2;
                auVar14._12_4_ = uVar2;
                auVar64 = minps(auVar50,auVar14);
                break;
              case 4:
                auVar65._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
                auVar65._8_4_ = -fVar58;
                auVar65._12_4_ = -fVar69;
                auVar50 = minps(auVar65,auVar40);
                auVar50 = maxps(auVar50,auVar51);
                fVar67 = auVar50._0_4_ * 1.442695 + 0.5;
                fVar69 = auVar50._4_4_ * 1.442695 + 0.5;
                fVar73 = auVar50._8_4_ * 1.442695 + 0.5;
                fVar75 = auVar50._12_4_ * 1.442695 + 0.5;
                fVar45 = (float)(int)fVar67;
                fVar58 = (float)(int)fVar69;
                fVar72 = (float)(int)fVar73;
                fVar74 = (float)(int)fVar75;
                fVar45 = fVar45 - (float)(-(uint)(fVar67 < fVar45) & (uint)fVar41);
                fVar58 = fVar58 - (float)(-(uint)(fVar69 < fVar58) & (uint)fVar42);
                fVar72 = fVar72 - (float)(-(uint)(fVar73 < fVar72) & (uint)fVar43);
                fVar74 = fVar74 - (float)(-(uint)(fVar75 < fVar74) & (uint)fVar44);
                fVar67 = fVar45 * -0.6931472 + auVar50._0_4_;
                fVar69 = fVar58 * -0.6931472 + auVar50._4_4_;
                fVar73 = fVar72 * -0.6931472 + auVar50._8_4_;
                fVar75 = fVar74 * -0.6931472 + auVar50._12_4_;
                auVar55._0_4_ =
                     fVar67 + fVar41 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                auVar55._4_4_ =
                     fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                auVar55._8_4_ =
                     fVar73 + fVar43 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73;
                auVar55._12_4_ =
                     fVar75 + fVar44 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75;
                fVar73 = (float)((int)fVar45 * 0x800000 + (int)fVar41) * auVar55._0_4_ + fVar41;
                fVar75 = (float)((int)fVar58 * 0x800000 + (int)fVar42) * auVar55._4_4_ + fVar42;
                fVar72 = (float)((int)fVar72 * 0x800000 + (int)fVar43) * auVar55._8_4_ + fVar43;
                fVar74 = (float)((int)fVar74 * 0x800000 + (int)fVar44) * auVar55._12_4_ + fVar44;
                auVar13._4_4_ = fVar75;
                auVar13._0_4_ = fVar73;
                auVar13._8_4_ = fVar72;
                auVar13._12_4_ = fVar74;
                auVar50 = rcpps(auVar55,auVar13);
                fVar45 = auVar50._0_4_;
                fVar67 = auVar50._4_4_;
                fVar58 = auVar50._8_4_;
                fVar69 = auVar50._12_4_;
                auVar64._0_4_ = (fVar41 - fVar73 * fVar45) * fVar45 + fVar45;
                auVar64._4_4_ = (fVar42 - fVar75 * fVar67) * fVar67 + fVar67;
                auVar64._8_4_ = (fVar43 - fVar72 * fVar58) * fVar58 + fVar58;
                auVar64._12_4_ = (fVar44 - fVar74 * fVar69) * fVar69 + fVar69;
                break;
              case 5:
                auVar50 = minps(auVar64,auVar40);
                auVar50 = maxps(auVar50,auVar51);
                fVar72 = auVar50._0_4_ * 1.442695 + 0.5;
                fVar73 = auVar50._4_4_ * 1.442695 + 0.5;
                fVar74 = auVar50._8_4_ * 1.442695 + 0.5;
                fVar75 = auVar50._12_4_ * 1.442695 + 0.5;
                fVar66 = (float)(int)fVar72;
                fVar68 = (float)(int)fVar73;
                fVar70 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar66 = fVar66 - (float)(-(uint)(fVar72 < fVar66) & (uint)fVar41);
                fVar68 = fVar68 - (float)(-(uint)(fVar73 < fVar68) & (uint)fVar42);
                fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar43);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar44);
                fVar72 = auVar50._0_4_ - fVar66 * 0.6931472;
                fVar73 = auVar50._4_4_ - fVar68 * 0.6931472;
                fVar74 = auVar50._8_4_ - fVar70 * 0.6931472;
                fVar75 = auVar50._12_4_ - fVar71 * 0.6931472;
                auVar78._0_4_ =
                     (float)((int)fVar66 * 0x800000 + (int)fVar41) *
                     (fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72) +
                     fVar41;
                auVar78._4_4_ =
                     (float)((int)fVar68 * 0x800000 + (int)fVar42) *
                     (fVar73 + fVar42 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73) +
                     fVar42;
                auVar78._8_4_ =
                     (float)((int)fVar70 * 0x800000 + (int)fVar43) *
                     (fVar74 + fVar43 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                     fVar43;
                auVar78._12_4_ =
                     (float)((int)fVar71 * 0x800000 + (int)fVar44) *
                     (fVar75 + fVar44 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75) +
                     fVar44;
                auVar50 = maxps(auVar78,_DAT_00516f50);
                fVar72 = (float)(auVar50._0_4_ & 0x807fffff | 0x3f000000);
                fVar74 = (float)(auVar50._4_4_ & 0x807fffff | 0x3f000000);
                fVar66 = (float)(auVar50._8_4_ & 0x807fffff | 0x3f000000);
                fVar70 = (float)(auVar50._12_4_ & 0x807fffff | 0x3f000000);
                fVar73 = fVar72 + -1.0 + (float)(-(uint)(fVar72 < 0.70710677) & (uint)fVar72);
                fVar75 = fVar74 + -1.0 + (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar74);
                fVar68 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                fVar71 = fVar70 + -1.0 + (float)(-(uint)(fVar70 < 0.70710677) & (uint)fVar70);
                auVar52._0_8_ =
                     CONCAT44(-(uint)(auVar78._4_4_ <= 0.0),-(uint)(auVar78._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar52._8_4_ = -(uint)(auVar78._8_4_ <= 0.0) & 0x7fffffff;
                auVar52._12_4_ = -(uint)(auVar78._12_4_ <= 0.0) & 0x7fffffff;
                auVar10._4_4_ =
                     ~-(uint)(auVar78._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar50._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar42)) * 0.6931472 +
                             fVar75 + (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 +
                                             0.116769984) * fVar75 + -0.12420141) * fVar75 +
                                           0.14249323) * fVar75 + -0.16668057) * fVar75 + 0.20000714
                                         ) * fVar75 + -0.24999994) * fVar75 + 0.3333333) * fVar75 +
                                      -0.5) * fVar75 * fVar75) * -2.0);
                auVar10._0_4_ =
                     ~-(uint)(auVar78._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar50._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar72 < 0.70710677) & (uint)fVar41)) * 0.6931472 +
                             fVar73 + (((((((((fVar73 * 0.070376836 + -0.1151461) * fVar73 +
                                             0.116769984) * fVar73 + -0.12420141) * fVar73 +
                                           0.14249323) * fVar73 + -0.16668057) * fVar73 + 0.20000714
                                         ) * fVar73 + -0.24999994) * fVar73 + 0.3333333) * fVar73 +
                                      -0.5) * fVar73 * fVar73) * -2.0);
                auVar10._8_4_ =
                     ~-(uint)(auVar78._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar50._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar43)) * 0.6931472 +
                             fVar68 + (((((((((fVar68 * 0.070376836 + -0.1151461) * fVar68 +
                                             0.116769984) * fVar68 + -0.12420141) * fVar68 +
                                           0.14249323) * fVar68 + -0.16668057) * fVar68 + 0.20000714
                                         ) * fVar68 + -0.24999994) * fVar68 + 0.3333333) * fVar68 +
                                      -0.5) * fVar68 * fVar68) * -2.0);
                auVar10._12_4_ =
                     ~-(uint)(auVar78._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar50._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar70 < 0.70710677) & (uint)fVar44)) * 0.6931472 +
                             fVar71 + (((((((((fVar71 * 0.070376836 + -0.1151461) * fVar71 +
                                             0.116769984) * fVar71 + -0.12420141) * fVar71 +
                                           0.14249323) * fVar71 + -0.16668057) * fVar71 + 0.20000714
                                         ) * fVar71 + -0.24999994) * fVar71 + 0.3333333) * fVar71 +
                                      -0.5) * fVar71 * fVar71) * -2.0);
                auVar50 = minps(auVar52 | auVar10,auVar40);
                auVar50 = maxps(auVar50,auVar51);
                fVar72 = auVar50._0_4_ * 1.442695 + 0.5;
                fVar73 = auVar50._4_4_ * 1.442695 + 0.5;
                fVar74 = auVar50._8_4_ * 1.442695 + 0.5;
                fVar75 = auVar50._12_4_ * 1.442695 + 0.5;
                fVar66 = (float)(int)fVar72;
                fVar68 = (float)(int)fVar73;
                fVar70 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar66 = fVar66 - (float)(-(uint)(fVar72 < fVar66) & (uint)fVar41);
                fVar68 = fVar68 - (float)(-(uint)(fVar73 < fVar68) & (uint)fVar42);
                fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar43);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar44);
                fVar72 = auVar50._0_4_ - fVar66 * 0.6931472;
                fVar73 = auVar50._4_4_ - fVar68 * 0.6931472;
                fVar74 = auVar50._8_4_ - fVar70 * 0.6931472;
                fVar75 = auVar50._12_4_ - fVar71 * 0.6931472;
                auVar53._0_4_ =
                     fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72;
                auVar53._4_4_ =
                     fVar73 + fVar42 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73;
                auVar53._8_4_ =
                     fVar74 + fVar43 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74;
                auVar53._12_4_ =
                     fVar75 + fVar44 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75;
                fVar66 = (float)((int)fVar66 * 0x800000 + (int)fVar41) * auVar53._0_4_ + fVar41;
                fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar42) * auVar53._4_4_ + fVar42;
                fVar70 = (float)((int)fVar70 * 0x800000 + (int)fVar43) * auVar53._8_4_ + fVar43;
                fVar71 = (float)((int)fVar71 * 0x800000 + (int)fVar44) * auVar53._12_4_ + fVar44;
                auVar15._4_4_ = fVar68;
                auVar15._0_4_ = fVar66;
                auVar15._8_4_ = fVar70;
                auVar15._12_4_ = fVar71;
                auVar50 = rcpps(auVar53,auVar15);
                fVar72 = auVar50._0_4_;
                fVar73 = auVar50._4_4_;
                fVar74 = auVar50._8_4_;
                fVar75 = auVar50._12_4_;
                auVar64._0_4_ =
                     fVar45 * (fVar72 + fVar72 + -1.0 + (2.0 - fVar66 * (fVar72 + fVar72)) * fVar72)
                ;
                auVar64._4_4_ =
                     fVar67 * (fVar73 + fVar73 + -1.0 + (2.0 - fVar68 * (fVar73 + fVar73)) * fVar73)
                ;
                auVar64._8_4_ =
                     fVar58 * (fVar74 + fVar74 + -1.0 + (2.0 - fVar70 * (fVar74 + fVar74)) * fVar74)
                ;
                auVar64._12_4_ =
                     fVar69 * (fVar75 + fVar75 + -1.0 + (2.0 - fVar71 * (fVar75 + fVar75)) * fVar75)
                ;
                break;
              case 6:
                fVar72 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar73 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar57._0_4_ = fVar72 * fVar45 + fVar73;
                auVar57._4_4_ = fVar72 * fVar67 + fVar73;
                auVar57._8_4_ = fVar72 * fVar58 + fVar73;
                auVar57._12_4_ = fVar72 * fVar69 + fVar73;
                auVar50 = maxps(auVar57,auVar50);
                auVar50 = minps(auVar50,auVar77);
                auVar64._0_4_ = fVar45 * auVar50._0_4_;
                auVar64._4_4_ = fVar67 * auVar50._4_4_;
                auVar64._8_4_ = fVar58 * auVar50._8_4_;
                auVar64._12_4_ = fVar69 * auVar50._12_4_;
              }
              *pauVar30 = auVar64;
              pauVar30 = pauVar30 + 1;
              bVar38 = iVar25 != iVar4;
              iVar25 = iVar25 + 1;
            } while (bVar38);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != _h);
      }
      bVar22 = (bVar22 ^ 1) & 0 < (int)_h ^ 1;
      if (iVar3 == 4 && bVar22 == 0) {
        local_40 = (long)top_blob->w * top_blob->elemsize;
        local_48 = top_blob->data;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_50 = (this->weight_data_packed).data;
        local_58 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_38 = (ulong)_h;
        local_110 = 0;
        do {
          pvVar20 = local_48;
          pvVar9 = local_b8.data;
          if (-1 < iVar4) {
            lVar36 = local_40 * local_110;
            pfVar27 = (float *)(local_58 * local_110 + (long)local_50);
            lVar35 = (long)local_b8.w;
            lVar19 = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar25 = 0;
            uVar32 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar39 = ZEXT812(0);
              }
              else {
                auVar39._4_8_ = 0;
                auVar39._0_4_ =
                     *(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) + local_110 * 4);
              }
              auVar40._12_4_ = 0;
              auVar40._0_12_ = auVar39;
              if (iVar21 < 1) {
                auVar40._12_4_ = 0;
              }
              else {
                p_Var8 = pp_Var7[-3];
                pfVar34 = (float *)((long)pvVar9 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar25) * 4);
                uVar31 = 0;
                pfVar26 = pfVar27;
                do {
                  auVar61 = auVar40;
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var8)) {
                    pfVar33 = pfVar34;
                    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                    do {
                      auVar60._4_4_ = pfVar26[3] * pfVar33[3] + pfVar26[1] * pfVar33[1];
                      auVar60._0_4_ = auVar60._4_4_;
                      auVar60._8_4_ = auVar60._4_4_;
                      auVar60._12_4_ = auVar60._4_4_;
                      auVar61._4_12_ = auVar60._4_12_;
                      auVar61._0_4_ =
                           auVar60._4_4_ +
                           auVar40._0_4_ + pfVar26[2] * pfVar33[2] + *pfVar26 * *pfVar33;
                      pfVar26 = pfVar26 + 4;
                      pfVar33 = pfVar33 + (*(int *)(&this->field_0xd8 + (long)p_Var8) << 2);
                      auVar40._4_4_ = auVar60._4_4_;
                      auVar40._0_4_ = auVar61._0_4_;
                      auVar40._8_4_ = auVar60._4_4_;
                      auVar40._12_4_ = auVar60._4_4_;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  auVar40 = auVar61;
                  uVar31 = uVar31 + 1;
                  pfVar34 = (float *)((long)pfVar34 + lVar35 * lVar19);
                } while (uVar31 != uVar37);
              }
              fVar41 = auVar40._0_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar41 <= 0.0) {
                  auVar16._12_4_ = 0;
                  auVar16._0_12_ = auVar40._4_12_;
                  auVar40 = auVar16 << 0x20;
                }
              default:
switchD_004f118f_default:
                fVar42 = auVar40._0_4_;
                break;
              case 2:
                fVar42 = (float)(-(uint)(0.0 < fVar41) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar41) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar41;
                break;
              case 3:
                fVar42 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar41 <= fVar42) {
                  auVar40._0_4_ = fVar42;
                }
                fVar42 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                if (auVar40._0_4_ <= fVar42) {
                  fVar42 = auVar40._0_4_;
                }
                break;
              case 4:
                if (88.37626 <= fVar41) {
                  fVar41 = 88.37626;
                }
                fVar41 = expf((float)(-(uint)(fVar41 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar41 < -88.37626) & (uint)-fVar41));
                fVar42 = 1.0 / (fVar41 + 1.0);
                break;
              case 5:
                local_68 = auVar40;
                fVar41 = expf(fVar41);
                fVar41 = logf(fVar41 + 1.0);
                fVar41 = tanhf(fVar41);
                fVar42 = fVar41 * (float)local_68._0_4_;
                break;
              case 6:
                fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar44 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar45 = -fVar44 / fVar43;
                fVar42 = 0.0;
                if (fVar45 <= fVar41) {
                  if (fVar45 + 1.0 / fVar43 < fVar41) goto switchD_004f118f_default;
                  fVar42 = (fVar43 * fVar41 + fVar44) * fVar41;
                }
              }
              *(float *)((long)pvVar20 + uVar32 * 4 + lVar36) = fVar42;
              uVar32 = uVar32 + 1;
              iVar25 = iVar25 + 4;
            } while (uVar32 != _w);
          }
          local_110 = local_110 + 1;
        } while (local_110 != local_38);
      }
      if (bVar22 == 0 && iVar3 == 1) {
        local_68._0_8_ = (long)top_blob->w * top_blob->elemsize;
        pvVar9 = top_blob->data;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar32 = 0;
        do {
          pvVar20 = local_b8.data;
          if (-1 < iVar4) {
            lVar35 = local_68._0_8_ * uVar32;
            lVar36 = (long)local_b8.w;
            lVar19 = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
            uVar31 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar59 = ZEXT812(0);
              }
              else {
                auVar59._4_8_ = 0;
                auVar59._0_4_ = *(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar32 * 4)
                ;
              }
              auVar62._12_4_ = 0;
              auVar62._0_12_ = auVar59;
              if (0 < iVar21) {
                iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                pfVar34 = (float *)((long)((int)uVar32 * iVar21 * iVar3) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var5));
                pfVar27 = (float *)((long)pvVar20 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * (int)uVar31)
                                   * 4);
                uVar28 = 0;
                do {
                  if (0 < iVar3) {
                    pfVar26 = pfVar27;
                    iVar25 = iVar3;
                    do {
                      auVar62._0_4_ = auVar62._0_4_ + *pfVar34 * *pfVar26;
                      pfVar34 = pfVar34 + 1;
                      pfVar26 = pfVar26 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar25 = iVar25 + -1;
                    } while (iVar25 != 0);
                  }
                  uVar28 = uVar28 + 1;
                  pfVar27 = (float *)((long)pfVar27 + lVar36 * lVar19);
                } while (uVar28 != uVar37);
              }
              fVar41 = auVar62._0_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar41 <= 0.0) {
                  auVar17._12_4_ = 0;
                  auVar17._0_12_ = auVar62._4_12_;
                  auVar62 = auVar17 << 0x20;
                }
              default:
switchD_004f142b_default:
                fVar42 = auVar62._0_4_;
                break;
              case 2:
                fVar42 = (float)(-(uint)(0.0 < fVar41) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar41) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar41;
                break;
              case 3:
                fVar42 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar41 <= fVar42) {
                  auVar62._0_4_ = fVar42;
                }
                fVar42 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                if (auVar62._0_4_ <= fVar42) {
                  fVar42 = auVar62._0_4_;
                }
                break;
              case 4:
                if (88.37626 <= fVar41) {
                  fVar41 = 88.37626;
                }
                fVar41 = expf((float)(-(uint)(fVar41 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar41 < -88.37626) & (uint)-fVar41));
                fVar42 = 1.0 / (fVar41 + 1.0);
                break;
              case 5:
                fVar42 = expf(fVar41);
                fVar42 = logf(fVar42 + 1.0);
                fVar42 = tanhf(fVar42);
                fVar42 = fVar42 * fVar41;
                break;
              case 6:
                fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar44 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar45 = -fVar44 / fVar43;
                fVar42 = 0.0;
                if (fVar45 <= fVar41) {
                  if (fVar45 + 1.0 / fVar43 < fVar41) goto switchD_004f142b_default;
                  fVar42 = (fVar43 * fVar41 + fVar44) * fVar41;
                }
              }
              *(float *)((long)pvVar9 + uVar31 * 4 + lVar35) = fVar42;
              uVar31 = uVar31 + 1;
            } while (uVar31 != _w);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != _h);
      }
      iVar29 = 0;
    }
  }
  piVar18 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar29;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}